

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O0

void __thiscall OPL_RDOSdump::SetClockRate(OPL_RDOSdump *this,double samples_per_tick)

{
  int iVar1;
  undefined1 local_2a;
  undefined1 local_29;
  undefined1 local_28;
  undefined1 local_27;
  undefined2 local_26;
  undefined1 auStack_24 [2];
  BYTE clock_change [4];
  WORD clock_word;
  int clock_mul;
  double clock_rate;
  double samples_per_tick_local;
  OPL_RDOSdump *this_local;
  
  (this->super_OPLDump).TimePerTick = (samples_per_tick / 49716.0) * 1000.0;
  register0x00001200 = samples_per_tick * 24.0;
  for (_auStack_24 = 1; 65535.0 < register0x00001200 / (double)_auStack_24 + 0.5;
      _auStack_24 = _auStack_24 + 1) {
  }
  iVar1 = (int)(register0x00001200 / (double)_auStack_24 + 0.5);
  local_26 = (undefined2)iVar1;
  if (((this->super_OPLDump).field_0x29 & 1) == 0) {
    local_2a = 0;
    local_29 = 2;
    local_28 = (undefined1)iVar1;
    local_27 = (undefined1)((uint)iVar1 >> 8);
    fwrite(&local_2a,1,4,(FILE *)(this->super_OPLDump).File);
  }
  else {
    fseek((FILE *)(this->super_OPLDump).File,8,0);
    fwrite(&local_26,2,1,(FILE *)(this->super_OPLDump).File);
    fseek((FILE *)(this->super_OPLDump).File,0,2);
    (this->super_OPLDump).field_0x29 = 0;
  }
  return;
}

Assistant:

virtual void SetClockRate(double samples_per_tick)
	{
		TimePerTick = samples_per_tick / OPL_SAMPLE_RATE * 1000.0;

		double clock_rate;
		int clock_mul;
		WORD clock_word;

		clock_rate = samples_per_tick * ADLIB_CLOCK_MUL;
		clock_mul = 1;

		// The RDos raw format's clock rate is stored in a word. Therefore,
		// the longest tick that can be stored is only ~55 ms.
		while (clock_rate / clock_mul + 0.5 > 65535.0)
		{
			clock_mul++;
		}
		clock_word = WORD(clock_rate / clock_mul + 0.5);

		if (NeedClockRate)
		{ // Set the initial clock rate.
			clock_word = LittleShort(clock_word);
			fseek(File, 8, SEEK_SET);
			fwrite(&clock_word, 2, 1, File);
			fseek(File, 0, SEEK_END);
			NeedClockRate = false;
		}
		else
		{ // Change the clock rate in the middle of the song.
			BYTE clock_change[4] = { 0, 2, BYTE(clock_word & 255), BYTE(clock_word >> 8) };
			fwrite(clock_change, 1, 4, File);
		}
	}